

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_deblk_edge_filter.c
# Opt level: O0

void ihevc_deblk_luma_horz
               (UWORD8 *pu1_src,WORD32 src_strd,WORD32 bs,WORD32 quant_param_p,WORD32 quant_param_q,
               WORD32 beta_offset_div2,WORD32 tc_offset_div2,WORD32 filter_flag_p,
               WORD32 filter_flag_q)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  byte *pbVar6;
  int in_ECX;
  int iVar7;
  int in_EDX;
  int in_ESI;
  byte *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  WORD32 delta_q;
  WORD32 delta_p;
  WORD32 delta;
  WORD32 tmp_q2;
  WORD32 tmp_q1;
  WORD32 tmp_q0;
  WORD32 tmp_p2;
  WORD32 tmp_p1;
  WORD32 tmp_p0;
  WORD32 col;
  WORD32 deq;
  WORD32 dep;
  WORD32 de;
  WORD32 d_sam3;
  WORD32 d_sam0;
  WORD32 d;
  WORD32 dq;
  WORD32 dp;
  WORD32 d3;
  WORD32 d0;
  WORD32 dq3;
  WORD32 dq0;
  WORD32 dp3;
  WORD32 dp0;
  WORD32 tc;
  WORD32 beta;
  WORD32 tc_indx;
  WORD32 beta_indx;
  WORD32 qp_luma;
  byte local_140;
  byte local_13c;
  int local_138;
  int local_134;
  byte local_130;
  byte local_12c;
  int local_128;
  int local_124;
  byte local_120;
  byte local_11c;
  byte local_118;
  byte local_114;
  int local_110;
  int local_10c;
  int local_108;
  byte local_104;
  byte local_100;
  byte local_fc;
  byte local_f8;
  byte local_f4;
  byte local_f0;
  byte local_ec;
  byte local_e8;
  byte local_e4;
  byte local_e0;
  byte local_dc;
  byte local_d8;
  int local_d0;
  int local_cc;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  byte local_84;
  byte local_80;
  byte local_7c;
  byte local_78;
  byte local_74;
  byte local_70;
  int local_6c;
  int local_60;
  byte *local_8;
  
  if (in_EDX < 1) {
    __assert_fail("((bs > 0))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/ihevc_deblk_edge_filter.c"
                  ,0x162,
                  "void ihevc_deblk_luma_horz(UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
                 );
  }
  if ((in_stack_00000010 == 0) && (in_stack_00000018 == 0)) {
    __assert_fail("(filter_flag_p || filter_flag_q)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/ihevc_deblk_edge_filter.c"
                  ,0x163,
                  "void ihevc_deblk_luma_horz(UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
                 );
  }
  iVar5 = in_ECX + in_R8D + 1 >> 1;
  if (iVar5 + in_R9D * 2 < 0x34) {
    if (iVar5 + in_R9D * 2 < 0) {
      local_98 = 0;
    }
    else {
      local_98 = iVar5 + in_R9D * 2;
    }
    local_94 = local_98;
  }
  else {
    local_94 = 0x33;
  }
  iVar7 = in_EDX >> 1;
  if (iVar5 + iVar7 * 2 + in_stack_00000008 * 2 < 0x36) {
    if (iVar5 + iVar7 * 2 + in_stack_00000008 * 2 < 0) {
      local_a0 = 0;
    }
    else {
      local_a0 = iVar5 + iVar7 * 2 + in_stack_00000008 * 2;
    }
    local_9c = local_a0;
  }
  else {
    local_9c = 0x35;
  }
  iVar5 = gai4_ihevc_beta_table[local_94];
  iVar7 = gai4_ihevc_tc_table[local_9c];
  if (iVar7 != 0) {
    if ((int)((uint)in_RDI[in_ESI << 1] + (uint)in_RDI[in_ESI] * -2 + (uint)*in_RDI) < 1) {
      local_a4 = -((uint)in_RDI[in_ESI << 1] + (uint)in_RDI[in_ESI] * -2 + (uint)*in_RDI);
    }
    else {
      local_a4 = (uint)in_RDI[in_ESI << 1] + (uint)in_RDI[in_ESI] * -2 + (uint)*in_RDI;
    }
    if ((int)((uint)in_RDI[in_ESI * 2 + 3] + (uint)in_RDI[in_ESI + 3] * -2 + (uint)in_RDI[3]) < 1) {
      local_a8 = -((uint)in_RDI[in_ESI * 2 + 3] + (uint)in_RDI[in_ESI + 3] * -2 + (uint)in_RDI[3]);
    }
    else {
      local_a8 = (uint)in_RDI[in_ESI * 2 + 3] + (uint)in_RDI[in_ESI + 3] * -2 + (uint)in_RDI[3];
    }
    if ((int)((uint)in_RDI[in_ESI * -3] + (uint)in_RDI[in_ESI * -2] * -2 + (uint)in_RDI[-in_ESI]) <
        1) {
      local_ac = -((uint)in_RDI[in_ESI * -3] + (uint)in_RDI[in_ESI * -2] * -2 +
                  (uint)in_RDI[-in_ESI]);
    }
    else {
      local_ac = (uint)in_RDI[in_ESI * -3] + (uint)in_RDI[in_ESI * -2] * -2 + (uint)in_RDI[-in_ESI];
    }
    if ((int)((uint)in_RDI[in_ESI * -3 + 3] + (uint)in_RDI[in_ESI * -2 + 3] * -2 +
             (uint)in_RDI[3 - in_ESI]) < 1) {
      local_b0 = -((uint)in_RDI[in_ESI * -3 + 3] + (uint)in_RDI[in_ESI * -2 + 3] * -2 +
                  (uint)in_RDI[3 - in_ESI]);
    }
    else {
      local_b0 = (uint)in_RDI[in_ESI * -3 + 3] + (uint)in_RDI[in_ESI * -2 + 3] * -2 +
                 (uint)in_RDI[3 - in_ESI];
    }
    local_60 = 0;
    bVar1 = false;
    bVar3 = false;
    if (local_ac + local_a4 + local_b0 + local_a8 < iVar5) {
      bVar1 = false;
      if ((local_ac + local_a4) * 2 < iVar5 >> 2) {
        if ((int)((uint)in_RDI[in_ESI * 3] - (uint)*in_RDI) < 1) {
          local_b4 = -((uint)in_RDI[in_ESI * 3] - (uint)*in_RDI);
        }
        else {
          local_b4 = (uint)in_RDI[in_ESI * 3] - (uint)*in_RDI;
        }
        if ((int)((uint)in_RDI[-in_ESI] - (uint)in_RDI[in_ESI * -4]) < 1) {
          local_bc = -((uint)in_RDI[-in_ESI] - (uint)in_RDI[in_ESI * -4]);
        }
        else {
          local_bc = (uint)in_RDI[-in_ESI] - (uint)in_RDI[in_ESI * -4];
        }
        if (local_b4 + local_bc < iVar5 >> 3) {
          if ((int)((uint)*in_RDI - (uint)in_RDI[-in_ESI]) < 1) {
            local_c0 = -((uint)*in_RDI - (uint)in_RDI[-in_ESI]);
          }
          else {
            local_c0 = (uint)*in_RDI - (uint)in_RDI[-in_ESI];
          }
          if (local_c0 < iVar7 * 5 + 1 >> 1) {
            bVar1 = true;
          }
        }
      }
      pbVar6 = in_RDI + 3;
      bVar3 = false;
      if ((local_b0 + local_a8) * 2 < iVar5 >> 2) {
        if ((int)((uint)pbVar6[in_ESI * 3] - (uint)*pbVar6) < 1) {
          local_c4 = -((uint)pbVar6[in_ESI * 3] - (uint)*pbVar6);
        }
        else {
          local_c4 = (uint)pbVar6[in_ESI * 3] - (uint)*pbVar6;
        }
        if ((int)((uint)pbVar6[-in_ESI] - (uint)pbVar6[in_ESI * -4]) < 1) {
          local_cc = -((uint)pbVar6[-in_ESI] - (uint)pbVar6[in_ESI * -4]);
        }
        else {
          local_cc = (uint)pbVar6[-in_ESI] - (uint)pbVar6[in_ESI * -4];
        }
        if (local_c4 + local_cc < iVar5 >> 3) {
          if ((int)((uint)*pbVar6 - (uint)pbVar6[-in_ESI]) < 1) {
            local_d0 = -((uint)*pbVar6 - (uint)pbVar6[-in_ESI]);
          }
          else {
            local_d0 = (uint)*pbVar6 - (uint)pbVar6[-in_ESI];
          }
          if (local_d0 < iVar7 * 5 + 1 >> 1) {
            bVar3 = true;
          }
        }
      }
      bVar2 = false;
      if (bVar1) {
        bVar2 = bVar3;
      }
      local_60 = 1;
      if (bVar2) {
        local_60 = 2;
      }
      bVar3 = 1 < iVar7 && local_a4 + local_a8 < iVar5 + (iVar5 >> 1) >> 3;
      bVar1 = 1 < iVar7 && local_ac + local_b0 < iVar5 + (iVar5 >> 1) >> 3;
    }
    if (local_60 != 0) {
      local_8 = in_RDI;
      for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
        local_70 = local_8[-in_ESI];
        local_74 = local_8[in_ESI * -2];
        local_78 = local_8[in_ESI * -3];
        local_7c = *local_8;
        local_80 = local_8[in_ESI];
        local_84 = local_8[in_ESI << 1];
        if (local_60 == 2) {
          cVar4 = (char)iVar7;
          if ((int)((uint)*local_8 + iVar7 * 2) <
              (int)((uint)local_8[in_ESI << 1] + (uint)local_8[in_ESI] * 2 + (uint)*local_8 * 2 +
                    (uint)local_8[-in_ESI] * 2 + (uint)local_8[in_ESI * -2] + 4) >> 3) {
            local_d8 = *local_8 + cVar4 * '\x02';
          }
          else {
            if ((int)((uint)local_8[in_ESI << 1] + (uint)local_8[in_ESI] * 2 + (uint)*local_8 * 2 +
                      (uint)local_8[-in_ESI] * 2 + (uint)local_8[in_ESI * -2] + 4) >> 3 <
                (int)((uint)*local_8 + iVar7 * -2)) {
              local_dc = *local_8 + cVar4 * -2;
            }
            else {
              local_dc = (byte)((int)((uint)local_8[in_ESI << 1] + (uint)local_8[in_ESI] * 2 +
                                      (uint)*local_8 * 2 + (uint)local_8[-in_ESI] * 2 +
                                      (uint)local_8[in_ESI * -2] + 4) >> 3);
            }
            local_d8 = local_dc;
          }
          local_7c = local_d8;
          if ((int)((uint)local_8[in_ESI] + iVar7 * 2) <
              (int)((uint)local_8[in_ESI << 1] + (uint)local_8[in_ESI] + (uint)*local_8 +
                    (uint)local_8[-in_ESI] + 2) >> 2) {
            local_e0 = local_8[in_ESI] + cVar4 * '\x02';
          }
          else {
            if ((int)((uint)local_8[in_ESI << 1] + (uint)local_8[in_ESI] + (uint)*local_8 +
                      (uint)local_8[-in_ESI] + 2) >> 2 < (int)((uint)local_8[in_ESI] + iVar7 * -2))
            {
              local_e4 = local_8[in_ESI] + cVar4 * -2;
            }
            else {
              local_e4 = (byte)((int)((uint)local_8[in_ESI << 1] + (uint)local_8[in_ESI] +
                                      (uint)*local_8 + (uint)local_8[-in_ESI] + 2) >> 2);
            }
            local_e0 = local_e4;
          }
          local_80 = local_e0;
          if ((int)((uint)local_8[in_ESI << 1] + iVar7 * 2) <
              (int)((uint)local_8[in_ESI * 3] * 2 + (uint)local_8[in_ESI << 1] * 3 +
                    (uint)local_8[in_ESI] + (uint)*local_8 + (uint)local_8[-in_ESI] + 4) >> 3) {
            local_e8 = local_8[in_ESI << 1] + cVar4 * '\x02';
          }
          else {
            if ((int)((uint)local_8[in_ESI * 3] * 2 + (uint)local_8[in_ESI << 1] * 3 +
                      (uint)local_8[in_ESI] + (uint)*local_8 + (uint)local_8[-in_ESI] + 4) >> 3 <
                (int)((uint)local_8[in_ESI << 1] + iVar7 * -2)) {
              local_ec = local_8[in_ESI << 1] + cVar4 * -2;
            }
            else {
              local_ec = (byte)((int)((uint)local_8[in_ESI * 3] * 2 + (uint)local_8[in_ESI << 1] * 3
                                      + (uint)local_8[in_ESI] + (uint)*local_8 +
                                      (uint)local_8[-in_ESI] + 4) >> 3);
            }
            local_e8 = local_ec;
          }
          local_84 = local_e8;
          if ((int)((uint)local_8[-in_ESI] + iVar7 * 2) <
              (int)((uint)local_8[in_ESI] + (uint)*local_8 * 2 + (uint)local_8[-in_ESI] * 2 +
                    (uint)local_8[in_ESI * -2] * 2 + (uint)local_8[in_ESI * -3] + 4) >> 3) {
            local_f0 = local_8[-in_ESI] + cVar4 * '\x02';
          }
          else {
            if ((int)((uint)local_8[in_ESI] + (uint)*local_8 * 2 + (uint)local_8[-in_ESI] * 2 +
                      (uint)local_8[in_ESI * -2] * 2 + (uint)local_8[in_ESI * -3] + 4) >> 3 <
                (int)((uint)local_8[-in_ESI] + iVar7 * -2)) {
              local_f4 = local_8[-in_ESI] + cVar4 * -2;
            }
            else {
              local_f4 = (byte)((int)((uint)local_8[in_ESI] + (uint)*local_8 * 2 +
                                      (uint)local_8[-in_ESI] * 2 + (uint)local_8[in_ESI * -2] * 2 +
                                      (uint)local_8[in_ESI * -3] + 4) >> 3);
            }
            local_f0 = local_f4;
          }
          local_70 = local_f0;
          if ((int)((uint)local_8[in_ESI * -2] + iVar7 * 2) <
              (int)((uint)*local_8 + (uint)local_8[-in_ESI] + (uint)local_8[in_ESI * -2] +
                    (uint)local_8[in_ESI * -3] + 2) >> 2) {
            local_f8 = local_8[in_ESI * -2] + cVar4 * '\x02';
          }
          else {
            if ((int)((uint)*local_8 + (uint)local_8[-in_ESI] + (uint)local_8[in_ESI * -2] +
                      (uint)local_8[in_ESI * -3] + 2) >> 2 <
                (int)((uint)local_8[in_ESI * -2] + iVar7 * -2)) {
              local_fc = local_8[in_ESI * -2] + cVar4 * -2;
            }
            else {
              local_fc = (byte)((int)((uint)*local_8 + (uint)local_8[-in_ESI] +
                                      (uint)local_8[in_ESI * -2] + (uint)local_8[in_ESI * -3] + 2)
                               >> 2);
            }
            local_f8 = local_fc;
          }
          local_74 = local_f8;
          if ((int)((uint)local_8[in_ESI * -3] + iVar7 * 2) <
              (int)((uint)*local_8 + (uint)local_8[-in_ESI] + (uint)local_8[in_ESI * -2] +
                    (uint)local_8[in_ESI * -3] * 3 + (uint)local_8[in_ESI * -4] * 2 + 4) >> 3) {
            local_100 = local_8[in_ESI * -3] + cVar4 * '\x02';
          }
          else {
            if ((int)((uint)*local_8 + (uint)local_8[-in_ESI] + (uint)local_8[in_ESI * -2] +
                      (uint)local_8[in_ESI * -3] * 3 + (uint)local_8[in_ESI * -4] * 2 + 4) >> 3 <
                (int)((uint)local_8[in_ESI * -3] + iVar7 * -2)) {
              local_104 = local_8[in_ESI * -3] + cVar4 * -2;
            }
            else {
              local_104 = (byte)((int)((uint)*local_8 + (uint)local_8[-in_ESI] +
                                       (uint)local_8[in_ESI * -2] + (uint)local_8[in_ESI * -3] * 3 +
                                       (uint)local_8[in_ESI * -4] * 2 + 4) >> 3);
            }
            local_100 = local_104;
          }
          local_78 = local_100;
        }
        else {
          local_110 = (int)(((uint)*local_8 - (uint)local_8[-in_ESI]) * 9 +
                            ((uint)local_8[in_ESI] - (uint)local_8[in_ESI * -2]) * -3 + 8) >> 4;
          local_108 = local_110;
          if (local_110 < 1) {
            local_108 = -local_110;
          }
          if (SBORROW4(local_108,iVar7 * 10) != local_108 + iVar7 * -10 < 0) {
            local_10c = iVar7;
            if (local_110 <= iVar7) {
              if (local_110 < -iVar7) {
                local_110 = -iVar7;
              }
              local_10c = local_110;
            }
            if ((int)((uint)local_8[-in_ESI] + local_10c) < 0x100) {
              if ((int)((uint)local_8[-in_ESI] + local_10c) < 0) {
                local_118 = 0;
              }
              else {
                local_118 = local_8[-in_ESI] + (char)local_10c;
              }
              local_114 = local_118;
            }
            else {
              local_114 = 0xff;
            }
            local_70 = local_114;
            if ((int)((uint)*local_8 - local_10c) < 0x100) {
              if ((int)((uint)*local_8 - local_10c) < 0) {
                local_120 = 0;
              }
              else {
                local_120 = *local_8 - (char)local_10c;
              }
              local_11c = local_120;
            }
            else {
              local_11c = 0xff;
            }
            local_7c = local_11c;
            local_134 = iVar7 >> 1;
            if (bVar1) {
              local_124 = local_134;
              if ((int)((((int)((uint)local_8[in_ESI * -3] + (uint)local_8[-in_ESI] + 1) >> 1) -
                        (uint)local_8[in_ESI * -2]) + local_10c) >> 1 <= local_134) {
                iVar5 = (int)((((int)((uint)local_8[in_ESI * -3] + (uint)local_8[-in_ESI] + 1) >> 1)
                              - (uint)local_8[in_ESI * -2]) + local_10c) >> 1;
                if (SBORROW4(iVar5,-local_134) == iVar5 + local_134 < 0) {
                  local_128 = (int)((((int)((uint)local_8[in_ESI * -3] + (uint)local_8[-in_ESI] + 1)
                                     >> 1) - (uint)local_8[in_ESI * -2]) + local_10c) >> 1;
                }
                else {
                  local_128 = -local_134;
                }
                local_124 = local_128;
              }
              if ((int)((uint)local_8[in_ESI * -2] + local_124) < 0x100) {
                if ((int)((uint)local_8[in_ESI * -2] + local_124) < 0) {
                  local_130 = 0;
                }
                else {
                  local_130 = local_8[in_ESI * -2] + (char)local_124;
                }
                local_12c = local_130;
              }
              else {
                local_12c = 0xff;
              }
              local_74 = local_12c;
            }
            if (bVar3) {
              if ((int)((((int)((uint)local_8[in_ESI << 1] + (uint)*local_8 + 1) >> 1) -
                        (uint)local_8[in_ESI]) - local_10c) >> 1 <= local_134) {
                iVar5 = (int)((((int)((uint)local_8[in_ESI << 1] + (uint)*local_8 + 1) >> 1) -
                              (uint)local_8[in_ESI]) - local_10c) >> 1;
                if (SBORROW4(iVar5,-local_134) == iVar5 + local_134 < 0) {
                  local_138 = (int)((((int)((uint)local_8[in_ESI << 1] + (uint)*local_8 + 1) >> 1) -
                                    (uint)local_8[in_ESI]) - local_10c) >> 1;
                }
                else {
                  local_138 = -local_134;
                }
                local_134 = local_138;
              }
              if ((int)((uint)local_8[in_ESI] + local_134) < 0x100) {
                if ((int)((uint)local_8[in_ESI] + local_134) < 0) {
                  local_140 = 0;
                }
                else {
                  local_140 = local_8[in_ESI] + (char)local_134;
                }
                local_13c = local_140;
              }
              else {
                local_13c = 0xff;
              }
              local_80 = local_13c;
            }
          }
        }
        if (in_stack_00000010 != 0) {
          local_8[in_ESI * -3] = local_78;
          local_8[in_ESI * -2] = local_74;
          local_8[-in_ESI] = local_70;
        }
        if (in_stack_00000018 != 0) {
          *local_8 = local_7c;
          local_8[in_ESI] = local_80;
          local_8[in_ESI << 1] = local_84;
        }
        local_8 = local_8 + 1;
      }
    }
  }
  return;
}

Assistant:

void ihevc_deblk_luma_horz(UWORD8 *pu1_src,
                           WORD32 src_strd,
                           WORD32 bs,
                           WORD32 quant_param_p,
                           WORD32 quant_param_q,
                           WORD32 beta_offset_div2,
                           WORD32 tc_offset_div2,
                           WORD32 filter_flag_p,
                           WORD32 filter_flag_q)
{
    WORD32 qp_luma, beta_indx, tc_indx;
    WORD32 beta, tc;
    WORD32 dp0, dp3, dq0, dq3, d0, d3, dp, dq, d;
    WORD32 d_sam0, d_sam3;
    WORD32 de, dep, deq;
    WORD32 col;
    WORD32 tmp_p0, tmp_p1, tmp_p2, tmp_q0, tmp_q1, tmp_q2;
    WORD32 delta, delta_p, delta_q;

    ASSERT((bs > 0));
    ASSERT(filter_flag_p || filter_flag_q);

    qp_luma = (quant_param_p + quant_param_q + 1) >> 1;
    beta_indx = CLIP3(qp_luma + (beta_offset_div2 << 1), 0, 51);

    /* BS based on implementation can take value 3 if it is intra/inter egde          */
    /* based on BS, tc index is calcuated by adding 2 * ( bs - 1) to QP and tc_offset */
    /* for BS = 1 adding factor is (0*2), BS = 2 or 3 adding factor is (1*2)          */
    /* the above desired functionallity is achieved by doing (2*(bs>>1))              */

    tc_indx = CLIP3(qp_luma + 2 * (bs >> 1) + (tc_offset_div2 << 1), 0, 53);

    beta = gai4_ihevc_beta_table[beta_indx];
    tc = gai4_ihevc_tc_table[tc_indx];
    if(0 == tc)
    {
        return;
    }

    dq0 = ABS(pu1_src[2 * src_strd] - 2 * pu1_src[1 * src_strd] +
                    pu1_src[0 * src_strd]);

    dq3 = ABS(pu1_src[3 + 2 * src_strd] - 2 * pu1_src[3 + 1 * src_strd] +
                    pu1_src[3 + 0 * src_strd]);

    dp0 = ABS(pu1_src[-3 * src_strd] - 2 * pu1_src[-2 * src_strd] +
                    pu1_src[-1 * src_strd]);

    dp3 = ABS(pu1_src[3 - 3 * src_strd] - 2 * pu1_src[3 - 2 * src_strd] +
                    pu1_src[3 - 1 * src_strd]);

    d0 = dp0 + dq0;
    d3 = dp3 + dq3;

    dp = dp0 + dp3;
    dq = dq0 + dq3;

    d = d0 + d3;

    de = 0;
    dep = 0;
    deq = 0;

    if(d < beta)
    {
        d_sam0 = 0;
        if((2 * d0 < (beta >> 2))
                        && (ABS(pu1_src[3 * src_strd] - pu1_src[0 * src_strd]) +
                                        ABS(pu1_src[-1 * src_strd] - pu1_src[-4 * src_strd])
                                        < (beta >> 3))
                        && ABS(pu1_src[0 * src_strd] - pu1_src[-1 * src_strd])
                        < ((5 * tc + 1) >> 1))
        {
            d_sam0 = 1;
        }

        pu1_src += 3;
        d_sam3 = 0;
        if((2 * d3 < (beta >> 2))
                        && (ABS(pu1_src[3 * src_strd] - pu1_src[0 * src_strd]) +
                                        ABS(pu1_src[-1 * src_strd] - pu1_src[-4 * src_strd])
                                        < (beta >> 3))
                        && ABS(pu1_src[0 * src_strd] - pu1_src[-1 * src_strd])
                        < ((5 * tc + 1) >> 1))
        {
            d_sam3 = 1;
        }
        pu1_src -= 3;

        de = (d_sam0 == 1 && d_sam3 == 1) ? 2 : 1;
        dep = (dp < ((beta + (beta >> 1)) >> 3)) ? 1 : 0;
        deq = (dq < ((beta + (beta >> 1)) >> 3)) ? 1 : 0;
        if(tc <= 1)
        {
            dep = 0;
            deq = 0;
        }
    }

    if(de != 0)
    {
        for(col = 0; col < 4; col++)
        {
            tmp_p0 = pu1_src[-1 * src_strd];
            tmp_p1 = pu1_src[-2 * src_strd];
            tmp_p2 = pu1_src[-3 * src_strd];

            tmp_q0 = pu1_src[0 * src_strd];
            tmp_q1 = pu1_src[1 * src_strd];
            tmp_q2 = pu1_src[2 * src_strd];
            if(de == 2)
            {
                tmp_q0 = CLIP3((pu1_src[2 * src_strd] +
                                2 * pu1_src[1 * src_strd] +
                                2 * pu1_src[0 * src_strd] +
                                2 * pu1_src[-1 * src_strd] +
                                pu1_src[-2 * src_strd] + 4) >> 3,
                                pu1_src[0 * src_strd] - 2 * tc,
                                pu1_src[0 * src_strd] + 2 * tc);

                tmp_q1 = CLIP3((pu1_src[2 * src_strd] +
                                pu1_src[1 * src_strd] +
                                pu1_src[0 * src_strd] +
                                pu1_src[-1 * src_strd] + 2) >> 2,
                                pu1_src[1 * src_strd] - 2 * tc,
                                pu1_src[1 * src_strd] + 2 * tc);

                tmp_q2 = CLIP3((2 * pu1_src[3 * src_strd] +
                                3 * pu1_src[2 * src_strd] +
                                pu1_src[1 * src_strd] +
                                pu1_src[0 * src_strd] +
                                pu1_src[-1 * src_strd] + 4) >> 3,
                                pu1_src[2 * src_strd] - 2 * tc,
                                pu1_src[2 * src_strd] + 2 * tc);

                tmp_p0 = CLIP3((pu1_src[1 * src_strd] +
                                2 * pu1_src[0 * src_strd] +
                                2 * pu1_src[-1 * src_strd] +
                                2 * pu1_src[-2 * src_strd] +
                                pu1_src[-3 * src_strd] + 4) >> 3,
                                pu1_src[-1 * src_strd] - 2 * tc,
                                pu1_src[-1 * src_strd] + 2 * tc);

                tmp_p1 = CLIP3((pu1_src[0 * src_strd] +
                                pu1_src[-1 * src_strd] +
                                pu1_src[-2 * src_strd] +
                                pu1_src[-3 * src_strd] + 2) >> 2,
                                pu1_src[-2 * src_strd] - 2 * tc,
                                pu1_src[-2 * src_strd] + 2 * tc);

                tmp_p2 = CLIP3((pu1_src[0 * src_strd] +
                                pu1_src[-1 * src_strd] +
                                pu1_src[-2 * src_strd] +
                                3 * pu1_src[-3 * src_strd] +
                                2 * pu1_src[-4 * src_strd] + 4) >> 3,
                                pu1_src[-3 * src_strd] - 2 * tc,
                                pu1_src[-3 * src_strd] + 2 * tc);
            }
            else
            {
                delta = (9 * (pu1_src[0 * src_strd] - pu1_src[-1 * src_strd]) -
                                3 * (pu1_src[1 * src_strd] - pu1_src[-2 * src_strd]) +
                                8) >> 4;
                if(ABS(delta) < 10 * tc)
                {
                    delta = CLIP3(delta, -tc, tc);

                    tmp_p0 = CLIP_U8(pu1_src[-1 * src_strd] + delta);
                    tmp_q0 = CLIP_U8(pu1_src[0 * src_strd] - delta);

                    if(dep == 1)
                    {
                        delta_p = CLIP3((((pu1_src[-3 * src_strd] +
                                        pu1_src[-1 * src_strd] + 1) >> 1) -
                                        pu1_src[-2 * src_strd] + delta) >> 1,
                                        -(tc >> 1),
                                        (tc >> 1));
                        tmp_p1 = CLIP_U8(pu1_src[-2 * src_strd] + delta_p);
                    }

                    if(deq == 1)
                    {
                        delta_q = CLIP3((((pu1_src[2 * src_strd] +
                                        pu1_src[0 * src_strd] + 1) >> 1) -
                                        pu1_src[1 * src_strd] - delta) >> 1,
                                        -(tc >> 1),
                                        (tc >> 1));
                        tmp_q1 = CLIP_U8(pu1_src[1 * src_strd] + delta_q);
                    }
                }
            }

            if(filter_flag_p != 0)
            {
                pu1_src[-3 * src_strd] = tmp_p2;
                pu1_src[-2 * src_strd] = tmp_p1;
                pu1_src[-1 * src_strd] = tmp_p0;
            }

            if(filter_flag_q != 0)
            {
                pu1_src[0 * src_strd] = tmp_q0;
                pu1_src[1 * src_strd] = tmp_q1;
                pu1_src[2 * src_strd] = tmp_q2;
            }

            pu1_src += 1;
        }
    }

}